

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intMan.c
# Opt level: O2

void Inter_ManClean(Inter_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  int i;
  long lVar2;
  
  pVVar1 = p->vInters;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    for (lVar2 = 0; lVar2 < pVVar1->nSize; lVar2 = lVar2 + 1) {
      Aig_ManStop((Aig_Man_t *)pVVar1->pArray[lVar2]);
      pVVar1 = p->vInters;
    }
    pVVar1->nSize = 0;
  }
  if (p->pCnfInter != (Cnf_Dat_t *)0x0) {
    Cnf_DataFree(p->pCnfInter);
  }
  if (p->pCnfFrames != (Cnf_Dat_t *)0x0) {
    Cnf_DataFree(p->pCnfFrames);
  }
  if (p->pInter != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pInter);
  }
  if (p->pFrames != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pFrames);
    return;
  }
  return;
}

Assistant:

void Inter_ManClean( Inter_Man_t * p )
{
    if ( p->vInters )
    {
        Aig_Man_t * pMan;
        int i;
        Vec_PtrForEachEntry( Aig_Man_t *, p->vInters, pMan, i )
            Aig_ManStop( pMan );
        Vec_PtrClear( p->vInters );
    }
    if ( p->pCnfInter )
        Cnf_DataFree( p->pCnfInter );
    if ( p->pCnfFrames )
        Cnf_DataFree( p->pCnfFrames );
    if ( p->pInter )
        Aig_ManStop( p->pInter );
    if ( p->pFrames )
        Aig_ManStop( p->pFrames );
}